

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalize_fake_var_array.hpp
# Opt level: O2

void __thiscall
front::optimization::scalize_fake_var_array::ScalizeFakeVarArray::optimize_functiom
          (ScalizeFakeVarArray *this,string *funcName,MirPackage *package,
          BmirVariableTable *bmirVariableTable,
          vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
          *insts)

{
  __index_type _Var1;
  pointer pvVar2;
  element_type *peVar3;
  element_type *peVar4;
  bool bVar5;
  int iVar6;
  __shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2> *p_Var7;
  variant_alternative_t<1UL,_variant<int,_VarId>_> *pvVar8;
  size_type sVar9;
  AssignInst *pAVar10;
  mapped_type *pmVar11;
  mapped_type *pmVar12;
  reference pvVar13;
  variant_alternative_t<1UL,_variant<VarId,_basic_string<char>_>_> *pvVar14;
  size_type sVar15;
  mapped_type *pmVar16;
  mapped_type *pmVar17;
  variant_alternative_t<0UL,_variant<int,_VarId>_> *pvVar18;
  variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *__v;
  _Variadic_union<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  *__p;
  const_iterator __position;
  uint32_t local_22c;
  undefined8 local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_220 [2];
  BmirVariableTable *local_210;
  _Variadic_union<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  local_208;
  undefined1 local_1f8;
  undefined4 local_1e8;
  uint32_t local_1d4;
  shared_ptr<mir::inst::Inst> mirInst;
  map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
  tmpVarId2Offset;
  VarId local_180;
  VarId local_170;
  Value local_160;
  Value local_140;
  _Variadic_union<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
  local_120 [2];
  string local_100;
  map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tmpVarId2VarSingleName;
  key_type local_b0;
  key_type local_90;
  key_type local_70;
  key_type local_50;
  
  tmpVarId2Offset._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tmpVarId2Offset._M_t._M_impl.super__Rb_tree_header._M_header;
  tmpVarId2Offset._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tmpVarId2Offset._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tmpVarId2Offset._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  tmpVarId2VarSingleName._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &tmpVarId2VarSingleName._M_t._M_impl.super__Rb_tree_header._M_header;
  tmpVarId2VarSingleName._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  tmpVarId2VarSingleName._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  tmpVarId2VarSingleName._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __v = (insts->
        super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  __position._M_current = __v;
  local_210 = bmirVariableTable;
  tmpVarId2Offset._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tmpVarId2Offset._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tmpVarId2VarSingleName._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       tmpVarId2VarSingleName._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (__v == (insts->
               super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&tmpVarId2VarSingleName._M_t);
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
      ::~_Rb_tree(&tmpVarId2Offset._M_t);
      return;
    }
    _Var1 = (__v->
            super__Variant_base<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            ).
            super__Move_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            .
            super__Copy_assign_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            .
            super__Move_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            .
            super__Copy_ctor_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            .
            super__Variant_storage_alias<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            ._M_index;
    if (_Var1 == '\x02') {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
      ::clear(&tmpVarId2Offset._M_t);
    }
    else if (_Var1 == '\0') {
      p_Var7 = &std::
                get<0ul,std::shared_ptr<mir::inst::Inst>,std::shared_ptr<mir::inst::JumpInstruction>,std::shared_ptr<front::irGenerator::JumpLabelId>>
                          (__v)->super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&mirInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>,p_Var7);
      iVar6 = (*((mirInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_Displayable)._vptr_Displayable[1])();
      peVar4 = mirInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (iVar6 == 1) {
        local_208._0_4_ =
             ((mirInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->dest
             ).id;
        sVar9 = std::
                map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                ::count(&tmpVarId2Offset,(key_type_conflict *)&local_208);
        if (sVar9 != 0) {
          if (*(char *)&peVar4[3].dest.super_Displayable._vptr_Displayable == '\0') {
            pvVar18 = std::get<0ul,int,mir::inst::VarId>
                                ((variant<int,_mir::inst::VarId> *)&peVar4[2].dest.id);
            iVar6 = *pvVar18;
            local_208._0_4_ = (peVar4->dest).id;
            pmVar11 = std::
                      map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                      ::operator[](&tmpVarId2Offset,(key_type_conflict *)&local_208);
            pmVar11->second = pmVar11->second + iVar6;
          }
          else {
            local_208._0_4_ = (peVar4->dest).id;
            std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
            ::erase(&tmpVarId2Offset._M_t,(key_type_conflict *)&local_208);
          }
        }
      }
      else if (iVar6 == 2) {
        if (*(char *)&mirInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      [2].dest.super_Displayable._vptr_Displayable == '\x01') {
          pvVar14 = std::get<1ul,mir::inst::VarId,std::__cxx11::string>
                              ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)(mirInst.
                                   super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr + 1));
          std::__cxx11::string::string((string *)&local_100,(string *)pvVar14);
          bVar5 = bmir_variable_table::BmirVariableTable::hasNameKey(local_210,&local_100);
          if (bVar5) {
            std::__cxx11::string::string((string *)&local_50,(string *)pvVar14);
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                      ::at(&local_210->name2VarArray,&local_50);
            bVar5 = ((pmVar12->
                     super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->changed;
            std::__cxx11::string::~string((string *)&local_50);
            std::__cxx11::string::~string((string *)&local_100);
            if (bVar5 != false) goto LAB_0013ae32;
            __p = &local_208;
            std::__cxx11::string::string((string *)&__p->_M_first,(string *)pvVar14);
            local_1e8 = 0;
            local_228 = CONCAT44(local_228._4_4_,(peVar4->dest).id);
            pmVar11 = std::
                      map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                      ::operator[](&tmpVarId2Offset,(key_type_conflict *)&local_228);
            std::
            pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
            ::operator=(pmVar11,(type)&__p->_M_first);
          }
          else {
            std::__cxx11::string::~string((string *)&local_100);
LAB_0013ae32:
            std::__cxx11::string::string((string *)&local_120[0]._M_first,(string *)pvVar14);
            bVar5 = bmir_variable_table::BmirVariableTable::hasVarSingle
                              (local_210,(string *)&local_120[0]._M_first);
            if (bVar5) {
              std::__cxx11::string::string((string *)&local_70,(string *)pvVar14);
              pmVar17 = std::
                        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                        ::at(&bmirVariableTable->name2VarSingle,&local_70);
              bVar5 = ((pmVar17->
                       super___shared_ptr<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr)->changed;
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&local_120[0]._M_first);
              if (bVar5 == false) {
                local_208._0_4_ = (peVar4->dest).id;
                pmVar16 = std::
                          map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator[](&tmpVarId2VarSingleName,(key_type_conflict *)&local_208);
                std::__cxx11::string::_M_assign((string *)pmVar16);
              }
              goto LAB_0013af02;
            }
            __p = local_120;
          }
          std::__cxx11::string::~string((string *)&__p->_M_first);
        }
      }
      else if (iVar6 == 3) {
        pvVar8 = std::get<1ul,int,mir::inst::VarId>
                           ((variant<int,_mir::inst::VarId> *)
                            &mirInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr[1].dest);
        local_208._0_4_ = pvVar8->id;
        sVar9 = std::
                map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                ::count(&tmpVarId2Offset,(key_type_conflict *)&local_208);
        if (sVar9 == 0) {
          local_208._0_4_ = pvVar8->id;
          sVar15 = std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::count(&tmpVarId2VarSingleName,(key_type_conflict *)&local_208);
          if (sVar15 != 0) {
            pvVar2 = (insts->
                     super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pAVar10 = (AssignInst *)operator_new(0x38);
            local_180.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
            local_180.id = (peVar4->dest).id;
            local_22c = pvVar8->id;
            pmVar16 = std::
                      map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[](&tmpVarId2VarSingleName,&local_22c);
            std::__cxx11::string::string((string *)&local_b0,(string *)pmVar16);
            pmVar17 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarSingle>_>_>_>
                      ::at(&bmirVariableTable->name2VarSingle,&local_b0);
            local_160._8_4_ =
                 ((pmVar17->
                  super___shared_ptr<front::optimization::bmir_variable_table::VarSingle,_(__gnu_cxx::_Lock_policy)2>
                  )._M_ptr)->initValue;
            local_160._24_1_ = 0;
            local_160.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dafa8;
            local_160.shift = Lsl;
            local_160.shift_amount = '\0';
            mir::inst::AssignInst::AssignInst(pAVar10,&local_180,&local_160);
            std::__shared_ptr<mir::inst::AssignInst,(__gnu_cxx::_Lock_policy)2>::
            __shared_ptr<mir::inst::AssignInst,void>
                      ((__shared_ptr<mir::inst::AssignInst,(__gnu_cxx::_Lock_policy)2> *)&local_228,
                       pAVar10);
            local_208._0_8_ = local_228;
            local_208._8_8_ = a_Stack_220[0]._M_pi;
            local_228 = 0;
            a_Stack_220[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_1f8 = 0;
            std::
            vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
            ::_M_insert_rval(insts,__position,(value_type *)&local_208._M_first);
            std::__detail::__variant::
            _Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
            ::~_Variant_storage((_Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                                 *)&local_208._M_first);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_220);
            std::__cxx11::string::~string((string *)&local_b0);
            std::
            vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
            ::erase(insts,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                           *)((long)__position._M_current +
                             (long)(insts->
                                   super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start +
                             (0x18 - (long)pvVar2)));
          }
        }
        else {
          pvVar2 = (insts->
                   super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pAVar10 = (AssignInst *)operator_new(0x38);
          local_170.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          local_170.id = (peVar4->dest).id;
          local_22c = pvVar8->id;
          pmVar11 = std::
                    map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                    ::operator[](&tmpVarId2Offset,&local_22c);
          std::__cxx11::string::string((string *)&local_90,(string *)pmVar11);
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<front::optimization::bmir_variable_table::VarArray>_>_>_>
                    ::at(&local_210->name2VarArray,&local_90);
          peVar3 = (pmVar12->
                   super___shared_ptr<front::optimization::bmir_variable_table::VarArray,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr;
          local_1d4 = pvVar8->id;
          pmVar11 = std::
                    map<unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>_>
                    ::operator[](&tmpVarId2Offset,&local_1d4);
          pvVar13 = std::vector<int,_std::allocator<int>_>::at
                              (&peVar3->initValues,(ulong)(pmVar11->second >> 2));
          local_140._8_4_ = *pvVar13;
          local_140._24_1_ = 0;
          local_140.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001dafa8;
          local_140.shift = Lsl;
          local_140.shift_amount = '\0';
          mir::inst::AssignInst::AssignInst(pAVar10,&local_170,&local_140);
          std::__shared_ptr<mir::inst::AssignInst,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<mir::inst::AssignInst,void>
                    ((__shared_ptr<mir::inst::AssignInst,(__gnu_cxx::_Lock_policy)2> *)&local_228,
                     pAVar10);
          local_208._0_8_ = local_228;
          local_208._8_8_ = a_Stack_220[0]._M_pi;
          local_228 = 0;
          a_Stack_220[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_1f8 = 0;
          std::
          vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
          ::_M_insert_rval(insts,__position,(value_type *)&local_208._M_first);
          std::__detail::__variant::
          _Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
          ::~_Variant_storage((_Variant_storage<false,_std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                               *)&local_208._M_first);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_220);
          std::__cxx11::string::~string((string *)&local_90);
          std::
          vector<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
          ::erase(insts,(variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>
                         *)((long)__position._M_current +
                           (long)(insts->
                                 super__Vector_base<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>,_std::allocator<std::variant<std::shared_ptr<mir::inst::Inst>,_std::shared_ptr<mir::inst::JumpInstruction>,_std::shared_ptr<front::irGenerator::JumpLabelId>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + (0x18 - (long)pvVar2))
                 );
        }
      }
LAB_0013af02:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mirInst.super___shared_ptr<mir::inst::Inst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    __v = __v + 1;
    __position._M_current = __position._M_current + 1;
  } while( true );
}

Assistant:

void optimize_functiom(
      std::string funcName, mir::inst::MirPackage& package,
      bmir_variable_table::BmirVariableTable& bmirVariableTable,
      std::vector<irGenerator::Instruction>& insts) {
    std::map<uint32_t, std::pair<std::string, uint32_t>> tmpVarId2Offset;
    std::map<uint32_t, std::string> tmpVarId2VarSingleName;
    for (auto instructionIter = insts.begin(); instructionIter != insts.end();
         instructionIter++) {
      if (instructionIter->index() == 0) {
        std::shared_ptr<mir::inst::Inst> mirInst =
            std::get<std::shared_ptr<mir::inst::Inst>>(*instructionIter);
        switch (mirInst->inst_kind()) {
          case mir::inst::InstKind::Ref: {
            mir::inst::RefInst* refInst = (mir::inst::RefInst*)mirInst.get();
            if (std::holds_alternative<std::string>(refInst->val)) {
              std::string& varName = std::get<std::string>(refInst->val);
              if (bmirVariableTable.hasNameKey(varName) &&
                  !bmirVariableTable.getVarArray(varName)->changed) {
                tmpVarId2Offset[refInst->dest] = {varName, 0};
              } else if (bmirVariableTable.hasVarSingle(varName) &&
                         !bmirVariableTable.getVarSingle(varName)->changed) {
                tmpVarId2VarSingleName[refInst->dest] = varName;
              }
            }
            break;
          }
          case mir::inst::InstKind::Load: {
            mir::inst::LoadInst* loadInst = (mir::inst::LoadInst*)mirInst.get();
            mir::inst::VarId& src = std::get<mir::inst::VarId>(loadInst->src);
            if (tmpVarId2Offset.count(src) > 0) {
              size_t index = instructionIter - insts.begin();
              insts.insert(
                  insts.begin() + index,
                  std::shared_ptr<mir::inst::AssignInst>(
                      new mir::inst::AssignInst(
                          loadInst->dest,
                          mir::inst::Value(
                              bmirVariableTable
                                  .getVarArray(tmpVarId2Offset[src].first)
                                  ->initValues.at(tmpVarId2Offset[src].second /
                                                  mir::types::INT_SIZE)))));
              insts.erase(insts.begin() + index + 1);
            } else if (tmpVarId2VarSingleName.count(src) > 0) {
              size_t index = instructionIter - insts.begin();
              insts.insert(
                  insts.begin() + index,
                  std::shared_ptr<mir::inst::AssignInst>(
                      new mir::inst::AssignInst(
                          loadInst->dest,
                          mir::inst::Value(
                              bmirVariableTable
                                  .getVarSingle(tmpVarId2VarSingleName[src])
                                  ->initValue))));
              insts.erase(insts.begin() + index + 1);
            }
            break;
          }
          case mir::inst::InstKind::Op: {
            mir::inst::OpInst* opInst = (mir::inst::OpInst*)mirInst.get();
            if (tmpVarId2Offset.count(opInst->dest) > 0) {
              if (std::holds_alternative<int32_t>(opInst->rhs)) {
                tmpVarId2Offset[opInst->dest].second +=
                    std::get<int32_t>(opInst->rhs);
              } else {
                tmpVarId2Offset.erase(opInst->dest);
              }
            }
            break;
          }
          default:
            break;
        }
      } else if (instructionIter->index() == 2) {
        tmpVarId2Offset.clear();
      }
    }
  }